

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftobjs.c
# Opt level: O0

FT_Error open_face_from_buffer
                   (FT_Library library,FT_Byte *base,FT_ULong size,FT_Long face_index,
                   char *driver_name,FT_Face *aface)

{
  FT_Memory memory_00;
  FT_Memory memory;
  undefined1 local_80 [4];
  FT_Error error;
  FT_Open_Args args;
  FT_Face *aface_local;
  char *driver_name_local;
  FT_Long face_index_local;
  FT_ULong size_local;
  FT_Byte *base_local;
  FT_Library library_local;
  
  memory_00 = library->memory;
  local_80 = (undefined1  [4])0x0;
  args.params = (FT_Parameter *)aface;
  if (driver_name != (char *)0x0) {
    args.stream = (FT_Stream)FT_Get_Module(library,driver_name);
    if (args.stream == (FT_Stream)0x0) {
      ft_mem_free(memory_00,base);
      return 0xb;
    }
    local_80 = (undefined1  [4])((uint)local_80 | 8);
  }
  library_local._4_4_ =
       new_memory_stream(library,base,size,memory_stream_close,(FT_Stream *)&args.pathname);
  if (library_local._4_4_ == 0) {
    local_80 = (undefined1  [4])((uint)local_80 | 2);
    library_local._4_4_ =
         ft_open_face_internal
                   (library,(FT_Open_Args *)local_80,face_index,(FT_Face *)args.params,'\0');
  }
  else {
    ft_mem_free(memory_00,base);
  }
  return library_local._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  open_face_from_buffer( FT_Library   library,
                         FT_Byte*     base,
                         FT_ULong     size,
                         FT_Long      face_index,
                         const char*  driver_name,
                         FT_Face     *aface )
  {
    FT_Open_Args  args;
    FT_Error      error;
    FT_Memory     memory = library->memory;


    args.flags = 0;

    if ( driver_name )
    {
      args.driver = FT_Get_Module( library, driver_name );
      if ( !args.driver )
      {
        FT_FREE( base );
        return FT_THROW( Missing_Module );
      }

      args.flags = args.flags | FT_OPEN_DRIVER;
    }

    /* `memory_stream_close` also frees the stream object. */
    error = new_memory_stream( library,
                               base,
                               size,
                               memory_stream_close,
                               &args.stream );
    if ( error )
    {
      FT_FREE( base );
      return error;
    }

    args.flags |= FT_OPEN_STREAM;

#ifdef FT_MACINTOSH
    /* At this point, the face index has served its purpose;  */
    /* whoever calls this function has already used it to     */
    /* locate the correct font data.  We should not propagate */
    /* this index to FT_Open_Face() (unless it is negative).  */

    if ( face_index > 0 )
      face_index &= 0x7FFF0000L; /* retain GX data */
#endif

    return ft_open_face_internal( library, &args, face_index, aface, 0 );
  }